

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_20::SetNodes
          (ChElementHexaCorot_20 *this,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeB,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeC,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeD,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeE,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeF,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeG,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeH,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeI,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeJ,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeK,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeL,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeM,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeN,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeO,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeP,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeQ,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeR,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeS,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeT)

{
  ChVariables *local_70;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_68;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeC->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeD->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[4].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeE->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[5].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeF->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[6].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeG->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[7].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeH->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[8].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeI->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[9].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeJ->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[10].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeK->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xb].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeL->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xc].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeM->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xd].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeN->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xe].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeO->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0xf].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeP->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0x10].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeQ->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0x11].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeR->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0x12].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeS->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[0x13].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeT->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[4].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[5].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[6].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[7].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[8].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[9].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[10].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0xb].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0xc].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0xd].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0xe].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0xf].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0x10].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0x11].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0x12].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  local_70 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[0x13].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_68,
             &local_70);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_68);
  ChKblockGeneric::SetVariables
            (&(this->super_ChElementGeneric).Kmatr,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_48);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void ChElementHexaCorot_20::SetNodes(std::shared_ptr<ChNodeFEAxyz> nodeA,
                                     std::shared_ptr<ChNodeFEAxyz> nodeB,
                                     std::shared_ptr<ChNodeFEAxyz> nodeC,
                                     std::shared_ptr<ChNodeFEAxyz> nodeD,
                                     std::shared_ptr<ChNodeFEAxyz> nodeE,
                                     std::shared_ptr<ChNodeFEAxyz> nodeF,
                                     std::shared_ptr<ChNodeFEAxyz> nodeG,
                                     std::shared_ptr<ChNodeFEAxyz> nodeH,
                                     std::shared_ptr<ChNodeFEAxyz> nodeI,
                                     std::shared_ptr<ChNodeFEAxyz> nodeJ,
                                     std::shared_ptr<ChNodeFEAxyz> nodeK,
                                     std::shared_ptr<ChNodeFEAxyz> nodeL,
                                     std::shared_ptr<ChNodeFEAxyz> nodeM,
                                     std::shared_ptr<ChNodeFEAxyz> nodeN,
                                     std::shared_ptr<ChNodeFEAxyz> nodeO,
                                     std::shared_ptr<ChNodeFEAxyz> nodeP,
                                     std::shared_ptr<ChNodeFEAxyz> nodeQ,
                                     std::shared_ptr<ChNodeFEAxyz> nodeR,
                                     std::shared_ptr<ChNodeFEAxyz> nodeS,
                                     std::shared_ptr<ChNodeFEAxyz> nodeT) {
    nodes[0] = nodeA;
    nodes[1] = nodeB;
    nodes[2] = nodeC;
    nodes[3] = nodeD;
    nodes[4] = nodeE;
    nodes[5] = nodeF;
    nodes[6] = nodeG;
    nodes[7] = nodeH;
    nodes[8] = nodeI;
    nodes[9] = nodeJ;
    nodes[10] = nodeK;
    nodes[11] = nodeL;
    nodes[12] = nodeM;
    nodes[13] = nodeN;
    nodes[14] = nodeO;
    nodes[15] = nodeP;
    nodes[16] = nodeQ;
    nodes[17] = nodeR;
    nodes[18] = nodeS;
    nodes[19] = nodeT;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&nodes[0]->Variables());
    mvars.push_back(&nodes[1]->Variables());
    mvars.push_back(&nodes[2]->Variables());
    mvars.push_back(&nodes[3]->Variables());
    mvars.push_back(&nodes[4]->Variables());
    mvars.push_back(&nodes[5]->Variables());
    mvars.push_back(&nodes[6]->Variables());
    mvars.push_back(&nodes[7]->Variables());
    mvars.push_back(&nodes[8]->Variables());
    mvars.push_back(&nodes[9]->Variables());
    mvars.push_back(&nodes[10]->Variables());
    mvars.push_back(&nodes[11]->Variables());
    mvars.push_back(&nodes[12]->Variables());
    mvars.push_back(&nodes[13]->Variables());
    mvars.push_back(&nodes[14]->Variables());
    mvars.push_back(&nodes[15]->Variables());
    mvars.push_back(&nodes[16]->Variables());
    mvars.push_back(&nodes[17]->Variables());
    mvars.push_back(&nodes[18]->Variables());
    mvars.push_back(&nodes[19]->Variables());
    Kmatr.SetVariables(mvars);
}